

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-hmac.c
# Opt level: O1

int ndn_hkdf(uint8_t *input_value,uint32_t input_size,uint8_t *output_value,uint32_t output_size,
            uint8_t *seed_value,uint32_t seed_size,uint8_t *info_value,uint32_t info_size)

{
  uint8_t *puVar1;
  bool bVar2;
  undefined4 uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  undefined1 local_358 [8];
  ndn_hmac_sha256_state_t state;
  uint8_t okm [256];
  undefined1 local_160 [8];
  ndn_hmac_key_t prk;
  ndn_hmac_key_t seed_key;
  uint8_t prk_bytes [32];
  uint8_t previous_output [32];
  int local_34;
  
  iVar6 = -0x12;
  if (output_size < 0x101) {
    prk_bytes[0x18] = '\0';
    prk_bytes[0x19] = '\0';
    prk_bytes[0x1a] = '\0';
    prk_bytes[0x1b] = '\0';
    prk_bytes[0x1c] = '\0';
    prk_bytes[0x1d] = '\0';
    prk_bytes[0x1e] = '\0';
    prk_bytes[0x1f] = '\0';
    memset(state.abs_state.s.key + 0x78,0,0x100);
    prk_bytes[8] = '\0';
    prk_bytes[9] = '\0';
    prk_bytes[10] = '\0';
    prk_bytes[0xb] = '\0';
    prk_bytes[0xc] = '\0';
    prk_bytes[0xd] = '\0';
    prk_bytes[0xe] = '\0';
    prk_bytes[0xf] = '\0';
    prk_bytes[0x10] = '\0';
    prk_bytes[0x11] = '\0';
    prk_bytes[0x12] = '\0';
    prk_bytes[0x13] = '\0';
    prk_bytes[0x14] = '\0';
    prk_bytes[0x15] = '\0';
    prk_bytes[0x16] = '\0';
    prk_bytes[0x17] = '\0';
    seed_key.abs_key.key_size = 0;
    seed_key.key_id = 0;
    prk_bytes[0] = '\0';
    prk_bytes[1] = '\0';
    prk_bytes[2] = '\0';
    prk_bytes[3] = '\0';
    prk_bytes[4] = '\0';
    prk_bytes[5] = '\0';
    prk_bytes[6] = '\0';
    prk_bytes[7] = '\0';
    if (seed_size == 0) {
      seed_value = prk_bytes + 0x18;
      seed_size = 0x20;
    }
    (*ndn_hmac_backend.load_key)((abstract_hmac_key_t *)&prk.abs_key.key_size,seed_value,seed_size);
    iVar4 = ndn_hmac_sha256(input_value,input_size,(ndn_hmac_key_t *)&prk.abs_key.key_size,
                            (uint8_t *)&seed_key.abs_key.key_size);
    iVar6 = -0x19;
    if (iVar4 == 0) {
      (*ndn_hmac_backend.load_key)
                ((abstract_hmac_key_t *)local_160,(uint8_t *)&seed_key.abs_key.key_size,0x20);
      local_34 = 1;
      iVar6 = (uint)((output_size & 0x1f) != 0) + (output_size >> 5);
      if (iVar6 != 0) {
        do {
          (*ndn_hmac_backend.hmac_sha256_init)
                    ((abstract_hmac_sha256_state_t *)local_358,(abstract_hmac_key_t *)local_160);
          (*ndn_hmac_backend.hmac_sha256_update)
                    ((abstract_hmac_sha256_state_t *)local_358,prk_bytes + 0x18,
                     (uint)(local_34 != 1) << 5);
          (*ndn_hmac_backend.hmac_sha256_update)
                    ((abstract_hmac_sha256_state_t *)local_358,info_value,info_size);
          (*ndn_hmac_backend.hmac_sha256_update)
                    ((abstract_hmac_sha256_state_t *)local_358,(uint8_t *)&local_34,1);
          (*ndn_hmac_backend.hmac_sha256_final)
                    ((abstract_hmac_sha256_state_t *)local_358,prk_bytes + 0x18);
          lVar5 = (long)(local_34 * 0x20 + -0x20);
          uVar3 = prk_bytes._28_4_;
          *(undefined4 *)(okm + lVar5 + -8) = prk_bytes._24_4_;
          *(undefined4 *)(okm + lVar5 + -4) = uVar3;
          puVar1 = okm + lVar5;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1 = okm + lVar5 + 4;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1 = okm + lVar5 + 8;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          puVar1 = okm + lVar5 + 0x10;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          iVar4 = local_34 + 1;
          bVar2 = local_34 < iVar6;
          local_34 = iVar4;
        } while (bVar2);
      }
      memcpy(output_value,state.abs_state.s.key + 0x78,(ulong)output_size);
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int
ndn_hkdf(const uint8_t* input_value, uint32_t input_size,
         uint8_t* output_value, uint32_t output_size,
         const uint8_t* seed_value, uint32_t seed_size,
         const uint8_t* info_value, uint32_t info_size)
{
  // parameter check
  if (output_size > NDN_SEC_HMAC_MAX_OUTPUT_SIZE) {
    return NDN_INVALID_ARG;
  }

  // state
  uint8_t previous_output[NDN_SEC_SHA256_HASH_SIZE] = {0};
  uint8_t okm[NDN_SEC_HMAC_MAX_OUTPUT_SIZE] = {0};

  // HKDF extract
  uint8_t prk_bytes[NDN_SEC_SHA256_HASH_SIZE] = {0};
  ndn_hmac_key_t seed_key;
  if (seed_size == 0) {
    ndn_hmac_load_key(&seed_key, previous_output, NDN_SEC_SHA256_HASH_SIZE);
  }
  else {
    ndn_hmac_load_key(&seed_key, seed_value, seed_size);
  }
  if (ndn_hmac_sha256(input_value, input_size, &seed_key, prk_bytes) != NDN_SUCCESS) {
    return NDN_SEC_CRYPTO_ALGO_FAILURE;
  }

  // load prk
  ndn_hmac_key_t prk;
  ndn_hmac_load_key(&prk, prk_bytes, NDN_SEC_SHA256_HASH_SIZE);

  // HKDF expand
  int N = output_size / NDN_SEC_SHA256_HASH_SIZE;
  if (output_size % NDN_SEC_SHA256_HASH_SIZE)
    N += 1;
  for (int i = 1; i <= N; i++) {
    ndn_hmac_sha256_state_t state;
    ndn_hmac_sha256_init(&state, &prk);
    ndn_hmac_sha256_update(&state, previous_output, i == 1 ? 0 : NDN_SEC_SHA256_HASH_SIZE);
    ndn_hmac_sha256_update(&state, info_value, info_size);
    ndn_hmac_sha256_update(&state, &i, 1);
    ndn_hmac_sha256_final(&state, previous_output);
    memcpy(okm + (i - 1) * NDN_SEC_SHA256_HASH_SIZE, previous_output, NDN_SEC_SHA256_HASH_SIZE);
  }
  memcpy(output_value, okm, output_size);
  return NDN_SUCCESS;
}